

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O1

int CBS_get_u64_decimal(CBS *cbs,uint64_t *out)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = 0;
  iVar3 = 0;
  do {
    if (cbs->len == 0) goto LAB_001c0016;
    bVar1 = *cbs->data;
    iVar2 = OPENSSL_isdigit((uint)bVar1);
    if (iVar2 == 0) {
      iVar2 = 3;
    }
    else {
      if (cbs->len != 0) {
        cbs->data = cbs->data + 1;
        cbs->len = cbs->len - 1;
      }
      iVar2 = 1;
      if (((uVar4 < 0x199999999999999a) && (uVar4 != 0 || iVar3 == 0)) &&
         (uVar5 = (ulong)bVar1 - 0x30, !CARRY8(uVar5,uVar4 * 10))) {
        iVar2 = 0;
        iVar3 = 1;
        uVar4 = uVar5 + uVar4 * 10;
      }
    }
  } while (iVar2 == 0);
  if (iVar2 == 3) {
LAB_001c0016:
    *out = uVar4;
  }
  else {
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int CBS_get_u64_decimal(CBS *cbs, uint64_t *out) {
  uint64_t v = 0;
  int seen_digit = 0;
  while (CBS_len(cbs) != 0) {
    uint8_t c = CBS_data(cbs)[0];
    if (!OPENSSL_isdigit(c)) {
      break;
    }
    CBS_skip(cbs, 1);
    if (/* Forbid stray leading zeros */
        (v == 0 && seen_digit) ||
        // Check for overflow.
        v > UINT64_MAX / 10 ||  //
        v * 10 > UINT64_MAX - (c - '0')) {
      return 0;
    }
    v = v * 10 + (c - '0');
    seen_digit = 1;
  }

  *out = v;
  return seen_digit;
}